

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborstreamreader.cpp
# Opt level: O3

qsizetype __thiscall
QCborStreamReaderPrivate::readStringChunk_byte
          (QCborStreamReaderPrivate *this,ReadStringChunk params,qsizetype len)

{
  long lVar1;
  void *pvVar2;
  qint64 qVar3;
  size_t sVar4;
  anon_union_8_3_4d1d901a_for_ReadStringChunk_0 this_00;
  long lVar5;
  
  pvVar2 = (void *)params.maxlen_or_type;
  this_00 = params.field_0;
  sVar4 = len;
  if ((long)pvVar2 < 0) {
    lVar5 = 0;
    if (pvVar2 == (void *)0xfffffffffffffffd) {
      this_00.ptr = (char *)0x0;
    }
    else {
      lVar5 = ((this_00.array)->d).size;
      if (SCARRY8(lVar5,len)) {
        this->corrupt = true;
        (this->lastError).c = DataTooLarge;
        return -1;
      }
      QByteArray::resize(this_00.array,lVar5 + len);
      this_00.ptr = ((this_00.array)->d).ptr + lVar5;
      lVar5 = 0;
    }
  }
  else {
    lVar1 = len - (long)pvVar2;
    lVar5 = 0;
    if (0 < lVar1) {
      lVar5 = lVar1;
    }
    if (-1 < lVar1) {
      len = (qsizetype)pvVar2;
    }
  }
  if (this->device != (QIODevice *)0x0) {
    pvVar2 = (void *)QIODevice::read(this->device,this_00._0_4_,(void *)len,sVar4);
    if (pvVar2 == (void *)len) {
      if (lVar5 == 0) {
        if (-1 < len) {
          return (qsizetype)(void *)len;
        }
      }
      else {
        qVar3 = QIODevice::skip(this->device,lVar5);
        if ((-1 < len) && (qVar3 == lVar5)) {
          return (qsizetype)(void *)len;
        }
      }
    }
    this->corrupt = true;
    (this->lastError).c = InputOutputError;
    return -1;
  }
  memcpy(this_00.ptr,(this->buffer).d.ptr + this->bufferStart,len);
  return (qsizetype)(void *)len;
}

Assistant:

inline qsizetype
QCborStreamReaderPrivate::readStringChunk_byte(ReadStringChunk params, qsizetype len)
{
    qint64 actuallyRead;
    qsizetype toRead = qsizetype(len);
    qsizetype left = 0;     // bytes from the chunk not copied to the user buffer, to discard
    char *ptr = nullptr;

    if (params.isPlainPointer()) {
        left = toRead - params.maxlen_or_type;
        if (left < 0)
            left = 0;                           // buffer bigger than string
        else
            toRead = params.maxlen_or_type;     // buffer smaller than string
        ptr = params.ptr;
    } else if (!params.isString()) {
        // See note above on having ensured there is enough incoming data.
        auto oldSize = params.array->size();
        auto newSize = oldSize;
        if (qAddOverflow<decltype(newSize)>(oldSize, toRead, &newSize)) {
            handleError(CborErrorDataTooLarge);
            return -1;
        }
        QT_TRY {
            params.array->resize(newSize);
        } QT_CATCH (const std::bad_alloc &) {
            // the distinction between DataTooLarge and OOM is mostly for
            // compatibility with Qt 5; in Qt 6, we could consider everything
            // to be OOM.
            handleError(newSize > QByteArray::maxSize() ? CborErrorDataTooLarge: CborErrorOutOfMemory);
            return -1;
        }

        ptr = const_cast<char *>(params.array->constBegin()) + oldSize;
    }